

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::set_projection_matrix(Application *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Application *this_local;
  
  glMatrixMode(0x1701);
  glLoadIdentity();
  dVar1 = Camera::v_fov(&this->camera);
  dVar2 = Camera::aspect_ratio(&this->camera);
  dVar3 = Camera::near_clip(&this->camera);
  dVar4 = Camera::far_clip(&this->camera);
  gluPerspective(dVar1,dVar2,dVar3,SUB84(dVar4,0));
  return;
}

Assistant:

void Application::set_projection_matrix() {
  glMatrixMode(GL_PROJECTION);
  glLoadIdentity();
  gluPerspective(camera.v_fov(),
                 camera.aspect_ratio(),
                 camera.near_clip(),
                 camera.far_clip());
}